

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool console::readline(string *line,bool multiline_input)

{
  byte bVar1;
  byte in_SIL;
  undefined8 in_RDI;
  bool in_stack_0000005f;
  string *in_stack_00000060;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 local_1;
  
  bVar1 = in_SIL & 1;
  set_display((display_t)((ulong)in_RDI >> 0x20));
  if ((simple_io & 1) == 0) {
    local_1 = readline_advanced(in_stack_00000060,in_stack_0000005f);
  }
  else {
    local_1 = readline_simple((string *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),false);
  }
  return local_1;
}

Assistant:

bool readline(std::string & line, bool multiline_input) {
        set_display(user_input);

        if (simple_io) {
            return readline_simple(line, multiline_input);
        }
        return readline_advanced(line, multiline_input);
    }